

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timerset.c
# Opt level: O1

int nn_timerset_rm(nn_timerset *self,nn_timerset_hndl *hndl)

{
  int iVar1;
  nn_timerset_hndl *pnVar2;
  uint uVar3;
  
  iVar1 = nn_list_item_isinlist(&hndl->list);
  if (iVar1 == 0) {
    uVar3 = 0;
  }
  else {
    pnVar2 = (nn_timerset_hndl *)nn_list_begin(&self->timeouts);
    uVar3 = (uint)(pnVar2 == hndl);
    nn_list_erase(&self->timeouts,&hndl->list);
  }
  return uVar3;
}

Assistant:

int nn_timerset_rm (struct nn_timerset *self, struct nn_timerset_hndl *hndl)
{
    int first;

    /*  Ignore if handle is not in the timeouts list. */
    if (!nn_list_item_isinlist (&hndl->list))
        return 0;

    /*  If it was the first timeout that was removed, the actual waiting time
        may have changed. We'll thus return 1 to let the user know. */
    first = nn_list_begin (&self->timeouts) == &hndl->list ? 1 : 0;
    nn_list_erase (&self->timeouts, &hndl->list);
    return first;
}